

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QString * __thiscall
QCommandLineParserPrivate::helpText
          (QString *__return_storage_ptr__,QCommandLineParserPrivate *this,bool includeQtOptions)

{
  PositionalArgumentDefinition *pPVar1;
  QObjectData *pQVar2;
  QCoreApplication *pQVar3;
  Flags FVar4;
  int iVar5;
  qsizetype len;
  QCommandLineOption *pQVar6;
  PositionalArgumentDefinition *names;
  int optionNameMaxWidth;
  QChar ch;
  QChar ch_00;
  char16_t *str;
  long lVar7;
  long lVar8;
  QString *optionName;
  QString *pQVar9;
  long lVar10;
  QArrayData *pQVar11;
  QCommandLineOption *this_00;
  long in_FS_OFFSET;
  QAnyStringView a;
  long local_148;
  QString local_138;
  QString local_118;
  QArrayDataPointer<QString> local_f8;
  QArrayDataPointer<QString> local_d8;
  QArrayDataPointer<QCommandLineOption> local_b8;
  QArrayDataPointer<QString> local_a0;
  QString local_88;
  undefined1 local_69 [25];
  QString *local_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_69[0] = 10;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar3 = QCoreApplication::self;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    str = L"<executable_name>";
    len = 0x11;
  }
  else {
    QCoreApplication::arguments();
    str = ((local_a0.ptr)->d).ptr;
    len = ((local_a0.ptr)->d).size;
  }
  QString::append(&local_88,(QChar *)str,len);
  if (pQVar3 != (QCoreApplication *)0x0) {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_a0);
  }
  local_b8.d = (this->commandLineOptionList).d.d;
  local_b8.ptr = (this->commandLineOptionList).d.ptr;
  local_b8.size = (this->commandLineOptionList).d.size;
  if (local_b8.d != (Data *)0x0) {
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((includeQtOptions) && (QCoreApplication::self != (QCoreApplication *)0x0)) {
    pQVar2 = (QCoreApplication::self->super_QObject).d_ptr.d;
    (*pQVar2->_vptr_QObjectData[4])(pQVar2,&local_b8);
  }
  if (local_b8.size != 0) {
    QCoreApplication::translate
              ((QString *)&local_d8,"QCommandLineParser","[options]",(char *)0x0,-1);
    local_50 = (QString *)local_d8.size;
    local_69._17_8_ = local_d8.ptr;
    local_69._9_8_ = local_d8.d;
    local_69._1_2_ = L' ';
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (QString *)0x0;
    local_d8.size = 0;
    ::operator+=(&local_88,(QStringBuilder<char16_t,_QString> *)(local_69 + 1));
    if ((QArrayData *)local_69._9_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_69._9_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_69._9_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_69._9_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_69._9_8_,2,0x10);
      }
    }
    if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,0x10);
      }
    }
  }
  lVar8 = (this->positionalArgumentDefinitions).d.size;
  if (lVar8 != 0) {
    pQVar11 = (QArrayData *)&((this->positionalArgumentDefinitions).d.ptr)->syntax;
    lVar8 = lVar8 * 0x48;
    do {
      local_69._1_2_ = L' ';
      local_69._9_8_ = pQVar11;
      ::operator+=(&local_88,(QStringBuilder<char16_t,_const_QString_&> *)(local_69 + 1));
      pQVar11 = (QArrayData *)&pQVar11[4].alloc;
      lVar8 = lVar8 + -0x48;
    } while (lVar8 != 0);
  }
  QCoreApplication::translate((QString *)&local_f8,"QCommandLineParser","Usage: %1",(char *)0x0,-1);
  a.m_size = local_88.d.size | 0x8000000000000000;
  a.field_0.m_data_utf16 = local_88.d.ptr;
  QString::arg_impl((QString *)&local_d8,(QString *)&local_f8,a,0,(QChar)0x20);
  local_69._17_8_ = local_d8.size;
  local_69._9_8_ = local_d8.ptr;
  local_69._1_8_ = local_d8.d;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (QString *)0x0;
  local_d8.size = 0;
  local_50 = (QString *)local_69;
  ::operator+=(__return_storage_ptr__,(QStringBuilder<QString,_const_QLatin1Char_&> *)(local_69 + 1)
              );
  if ((QArrayData *)local_69._1_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_69._1_8_,2,0x10);
    }
  }
  if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,0x10);
    }
  }
  if ((this->description).d.size != 0) {
    local_69._1_8_ = &this->description;
    local_69._9_8_ = (QString *)local_69;
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<const_QString_&,_const_QLatin1Char_&> *)(local_69 + 1));
  }
  ch.ucs._1_1_ = 0;
  ch.ucs._0_1_ = local_69[0];
  QString::append(__return_storage_ptr__,ch);
  if (local_b8.size != 0) {
    QCoreApplication::translate((QString *)&local_d8,"QCommandLineParser","Options:",(char *)0x0,-1)
    ;
    local_69._17_8_ = local_d8.size;
    local_69._9_8_ = local_d8.ptr;
    local_69._1_8_ = local_d8.d;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (QString *)0x0;
    local_d8.size = 0;
    local_50 = (QString *)local_69;
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QString,_const_QLatin1Char_&> *)(local_69 + 1));
    if ((QArrayData *)local_69._1_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_69._1_8_,2,0x10);
      }
    }
    if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (QString *)0x0;
  local_d8.size = 0;
  QList<QString>::reserve((QList<QString> *)&local_d8,local_b8.size);
  if (local_b8.size == 0) {
    local_148 = 0;
  }
  else {
    pQVar6 = local_b8.ptr + local_b8.size;
    local_148 = 0;
    this_00 = local_b8.ptr;
    do {
      FVar4 = QCommandLineOption::flags(this_00);
      if (((uint)FVar4.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                 super_QFlagsStorage<QCommandLineOption::Flag>.i & 1) == 0) {
        local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QCommandLineOption::names((QStringList *)&local_f8,this_00);
        local_118.d.d = (Data *)0x0;
        local_118.d.ptr = (char16_t *)0x0;
        local_118.d.size = 0;
        if ((QString *)local_f8.size != (QString *)0x0) {
          lVar8 = local_f8.size * 0x18;
          pQVar9 = local_f8.ptr;
          do {
            local_69._1_8_ = (ulong)((pQVar9->d).size != 1) + 1;
            local_69._9_8_ = "--";
            local_50 = (QString *)0x2;
            local_48 = ", ";
            local_69._17_8_ = pQVar9;
            ::operator+=(&local_118,
                         (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
                          *)(local_69 + 1));
            pQVar9 = pQVar9 + 1;
            lVar8 = lVar8 + -0x18;
          } while (lVar8 != 0);
        }
        if ((QString *)local_f8.size != (QString *)0x0) {
          QString::chop(&local_118,2);
        }
        local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QCommandLineOption::valueName(&local_138,this_00);
        if ((undefined1 *)local_138.d.size != (undefined1 *)0x0) {
          local_69._1_8_ = (QArrayData *)0x2;
          local_69._9_8_ = " <";
          local_69._17_8_ = &local_138;
          local_50 = (QString *)CONCAT62(local_50._2_6_,0x3e);
          ::operator+=(&local_118,
                       (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_char16_t> *)
                       (local_69 + 1));
        }
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,&local_118);
        QList<QString>::end((QList<QString> *)&local_d8);
        lVar8 = local_118.d.size;
        if (local_118.d.size < local_148) {
          lVar8 = local_148;
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_f8);
        local_148 = lVar8;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pQVar6);
  }
  lVar8 = (this->positionalArgumentDefinitions).d.size;
  if (lVar8 != 0) {
    lVar7 = 0;
    lVar10 = local_148;
    do {
      local_148 = *(long *)((long)&(((this->positionalArgumentDefinitions).d.ptr)->name).d.size +
                           lVar7);
      if (local_148 < lVar10) {
        local_148 = lVar10;
      }
      lVar7 = lVar7 + 0x48;
      lVar10 = local_148;
    } while (lVar8 * 0x48 != lVar7);
  }
  iVar5 = (int)local_148 + 1;
  optionNameMaxWidth = 0x32;
  if (iVar5 < 0x32) {
    optionNameMaxWidth = iVar5;
  }
  if (local_b8.size != 0) {
    lVar8 = local_b8.size << 3;
    pQVar6 = local_b8.ptr;
    pQVar9 = local_d8.ptr;
    do {
      FVar4 = QCommandLineOption::flags(pQVar6);
      if (((uint)FVar4.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                 super_QFlagsStorage<QCommandLineOption::Flag>.i & 1) == 0) {
        QCommandLineOption::description((QString *)&local_f8,pQVar6);
        wrapText((QString *)(local_69 + 1),pQVar9,optionNameMaxWidth,(QString *)&local_f8);
        QString::append(__return_storage_ptr__,(QString *)(local_69 + 1));
        if ((QArrayData *)local_69._1_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_69._1_8_,2,0x10);
          }
        }
        if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,0x10);
          }
        }
        pQVar9 = pQVar9 + 1;
      }
      pQVar6 = pQVar6 + 1;
      lVar8 = lVar8 + -8;
    } while (lVar8 != 0);
  }
  if ((this->positionalArgumentDefinitions).d.size != 0) {
    if (local_b8.size != 0) {
      ch_00.ucs._1_1_ = 0;
      ch_00.ucs._0_1_ = local_69[0];
      QString::append(__return_storage_ptr__,ch_00);
    }
    QCoreApplication::translate
              ((QString *)&local_f8,"QCommandLineParser","Arguments:",(char *)0x0,-1);
    local_69._17_8_ = local_f8.size;
    local_69._9_8_ = local_f8.ptr;
    local_69._1_8_ = local_f8.d;
    local_f8.d = (Data *)0x0;
    local_f8.ptr = (QString *)0x0;
    local_f8.size = 0;
    local_50 = (QString *)local_69;
    ::operator+=(__return_storage_ptr__,
                 (QStringBuilder<QString,_const_QLatin1Char_&> *)(local_69 + 1));
    if ((QArrayData *)local_69._1_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_69._1_8_,2,0x10);
      }
    }
    if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.d)->super_QArrayData,2,0x10);
      }
    }
    lVar8 = (this->positionalArgumentDefinitions).d.size;
    if (lVar8 != 0) {
      names = (this->positionalArgumentDefinitions).d.ptr;
      pPVar1 = names + lVar8;
      do {
        wrapText((QString *)(local_69 + 1),&names->name,optionNameMaxWidth,&names->description);
        QString::append(__return_storage_ptr__,(QString *)(local_69 + 1));
        if ((QArrayData *)local_69._1_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_69._1_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_69._1_8_,2,0x10);
          }
        }
        names = names + 1;
      } while (names != pPVar1);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<QCommandLineOption>::~QArrayDataPointer(&local_b8);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCommandLineParserPrivate::helpText(bool includeQtOptions) const
{
    const QLatin1Char nl('\n');
    QString text;
    QString usage;
    // executable name
    usage += qApp ? QStringView(QCoreApplication::arguments().constFirst())
                  : QStringView(u"<executable_name>");
    QList<QCommandLineOption> options = commandLineOptionList;
    if (includeQtOptions && qApp)
        qApp->d_func()->addQtOptions(&options);
    if (!options.isEmpty())
        usage += u' ' + QCommandLineParser::tr("[options]");
    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        usage += u' ' + arg.syntax;
    text += QCommandLineParser::tr("Usage: %1").arg(usage) + nl;
    if (!description.isEmpty())
        text += description + nl;
    text += nl;
    if (!options.isEmpty())
        text += QCommandLineParser::tr("Options:") + nl;

    QStringList optionNameList;
    optionNameList.reserve(options.size());
    qsizetype longestOptionNameString = 0;
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        const QStringList optionNames = option.names();
        QString optionNamesString;
        for (const QString &optionName : optionNames) {
            const int numDashes = optionName.size() == 1 ? 1 : 2;
            optionNamesString += QLatin1StringView("--", numDashes) + optionName + ", "_L1;
        }
        if (!optionNames.isEmpty())
            optionNamesString.chop(2); // remove trailing ", "
        const auto valueName = option.valueName();
        if (!valueName.isEmpty())
            optionNamesString += " <"_L1 + valueName + u'>';
        optionNameList.append(optionNamesString);
        longestOptionNameString = qMax(longestOptionNameString, optionNamesString.size());
    }

    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        longestOptionNameString = qMax(longestOptionNameString, arg.name.size());

    ++longestOptionNameString;
    const int optionNameMaxWidth = qMin(50, int(longestOptionNameString));
    auto optionNameIterator = optionNameList.cbegin();
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        text += wrapText(*optionNameIterator, optionNameMaxWidth, option.description());
        ++optionNameIterator;
    }
    if (!positionalArgumentDefinitions.isEmpty()) {
        if (!options.isEmpty())
            text += nl;
        text += QCommandLineParser::tr("Arguments:") + nl;
        for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
            text += wrapText(arg.name, optionNameMaxWidth, arg.description);
    }
    return text;
}